

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

int __thiscall pybind11::detail::enum_base::init(enum_base *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  internals *piVar1;
  byte in_DL;
  str_attr_accessor local_5f0;
  str_attr_accessor local_5d0;
  is_method local_5b0;
  type local_5a1;
  cpp_function local_5a0;
  object local_598;
  object getstate;
  is_method local_570;
  type local_561;
  cpp_function local_560;
  str_attr_accessor local_558;
  is_method local_538;
  type local_529;
  cpp_function local_528;
  str_attr_accessor local_520;
  is_method local_500;
  type local_4f1;
  cpp_function local_4f0;
  str_attr_accessor local_4e8;
  is_method local_4c8;
  type local_4b9;
  cpp_function local_4b8;
  str_attr_accessor local_4b0;
  is_method local_490;
  type local_481;
  cpp_function local_480;
  str_attr_accessor local_478;
  is_method local_458;
  type local_449;
  cpp_function local_448;
  str_attr_accessor local_440;
  is_method local_420;
  type local_411;
  cpp_function local_410;
  str_attr_accessor local_408;
  is_method local_3e8;
  type local_3d9;
  cpp_function local_3d8;
  str_attr_accessor local_3d0;
  is_method local_3b0;
  type local_3a1;
  cpp_function local_3a0;
  str_attr_accessor local_398;
  is_method local_378;
  type local_369;
  cpp_function local_368;
  str_attr_accessor local_360;
  is_method local_340;
  type local_331;
  cpp_function local_330;
  str_attr_accessor local_328;
  is_method local_308;
  type local_2f9;
  cpp_function local_2f8;
  str_attr_accessor local_2f0;
  is_method local_2d0;
  type local_2c1;
  cpp_function local_2c0;
  str_attr_accessor local_2b8;
  is_method local_298;
  type local_289;
  cpp_function local_288;
  str_attr_accessor local_280;
  is_method local_260;
  type local_251;
  cpp_function local_250;
  str_attr_accessor local_248;
  is_method local_228;
  type local_219;
  cpp_function local_218;
  str_attr_accessor local_210;
  is_method local_1f0;
  type local_1e1;
  cpp_function local_1e0;
  str_attr_accessor local_1d8;
  is_method local_1b8;
  type local_1a9;
  cpp_function local_1a8;
  str_attr_accessor local_1a0;
  is_method local_180;
  type local_171;
  cpp_function local_170;
  str_attr_accessor local_168;
  none local_148;
  none local_140;
  type local_131;
  cpp_function local_130;
  object local_128;
  str_attr_accessor local_120;
  none local_100;
  none local_f8;
  type local_e9;
  cpp_function local_e8;
  object local_e0;
  str_attr_accessor local_d8;
  is_method local_b8;
  type local_a9;
  cpp_function local_a8;
  object local_a0;
  str_attr_accessor local_98;
  is_method local_78;
  type local_69;
  cpp_function local_68;
  handle local_60;
  handle static_property;
  handle property;
  str_attr_accessor local_40;
  dict local_20;
  byte local_12;
  byte local_11;
  bool is_convertible_local;
  enum_base *peStack_10;
  bool is_arithmetic_local;
  enum_base *this_local;
  
  local_11 = (byte)ctx & 1;
  local_12 = in_DL & 1;
  peStack_10 = this;
  dict::dict(&local_20);
  object_api<pybind11::handle>::attr(&local_40,(object_api<pybind11::handle> *)this,"__entries");
  accessor<pybind11::detail::accessor_policies::str_attr>::operator=(&local_40,&local_20);
  accessor<pybind11::detail::accessor_policies::str_attr>::~accessor(&local_40);
  dict::~dict(&local_20);
  handle::handle(&static_property,(PyObject *)&PyProperty_Type);
  piVar1 = get_internals();
  handle::handle(&local_60,(PyObject *)piVar1->static_property_type);
  is_method::is_method(&local_78,&this->m_base);
  cpp_function::
  cpp_function<pybind11::detail::enum_base::init(bool,bool)::_lambda(pybind11::handle)_1_,pybind11::is_method,void>
            (&local_68,&local_69,&local_78);
  object_api<pybind11::handle>::attr(&local_98,(object_api<pybind11::handle> *)this,"__repr__");
  accessor<pybind11::detail::accessor_policies::str_attr>::operator=(&local_98,&local_68);
  accessor<pybind11::detail::accessor_policies::str_attr>::~accessor(&local_98);
  cpp_function::~cpp_function(&local_68);
  is_method::is_method(&local_b8,&this->m_base);
  cpp_function::
  cpp_function<pybind11::detail::enum_base::init(bool,bool)::_lambda(pybind11::handle)_2_,pybind11::is_method,void>
            (&local_a8,&local_a9,&local_b8);
  object_api<pybind11::handle>::operator()
            ((object_api<pybind11::handle> *)&local_a0,(cpp_function *)&static_property);
  object_api<pybind11::handle>::attr(&local_d8,(object_api<pybind11::handle> *)this,"name");
  accessor<pybind11::detail::accessor_policies::str_attr>::operator=(&local_d8,&local_a0);
  accessor<pybind11::detail::accessor_policies::str_attr>::~accessor(&local_d8);
  pybind11::object::~object(&local_a0);
  cpp_function::~cpp_function(&local_a8);
  cpp_function::
  cpp_function<pybind11::detail::enum_base::init(bool,bool)::_lambda(pybind11::handle)_3_,,void>
            (&local_e8,&local_e9);
  none::none(&local_f8);
  none::none(&local_100);
  object_api<pybind11::handle>::operator()
            ((object_api<pybind11::handle> *)&local_e0,(cpp_function *)&local_60,(none *)&local_e8,
             &local_f8,(char (*) [1])&local_100);
  object_api<pybind11::handle>::attr(&local_120,(object_api<pybind11::handle> *)this,"__doc__");
  accessor<pybind11::detail::accessor_policies::str_attr>::operator=(&local_120,&local_e0);
  accessor<pybind11::detail::accessor_policies::str_attr>::~accessor(&local_120);
  pybind11::object::~object(&local_e0);
  none::~none(&local_100);
  none::~none(&local_f8);
  cpp_function::~cpp_function(&local_e8);
  cpp_function::
  cpp_function<pybind11::detail::enum_base::init(bool,bool)::_lambda(pybind11::handle)_4_,,void>
            (&local_130,&local_131);
  none::none(&local_140);
  none::none(&local_148);
  object_api<pybind11::handle>::operator()
            ((object_api<pybind11::handle> *)&local_128,(cpp_function *)&local_60,(none *)&local_130
             ,&local_140,(char (*) [1])&local_148);
  object_api<pybind11::handle>::attr(&local_168,(object_api<pybind11::handle> *)this,"__members__");
  accessor<pybind11::detail::accessor_policies::str_attr>::operator=(&local_168,&local_128);
  accessor<pybind11::detail::accessor_policies::str_attr>::~accessor(&local_168);
  pybind11::object::~object(&local_128);
  none::~none(&local_148);
  none::~none(&local_140);
  cpp_function::~cpp_function(&local_130);
  if ((local_12 & 1) == 0) {
    is_method::is_method(&local_458,&this->m_base);
    cpp_function::
    cpp_function<pybind11::detail::enum_base::init(bool,bool)::_lambda(pybind11::object,pybind11::object)_13_,pybind11::is_method,void>
              (&local_448,&local_449,&local_458);
    object_api<pybind11::handle>::attr(&local_478,(object_api<pybind11::handle> *)this,"__eq__");
    accessor<pybind11::detail::accessor_policies::str_attr>::operator=(&local_478,&local_448);
    accessor<pybind11::detail::accessor_policies::str_attr>::~accessor(&local_478);
    cpp_function::~cpp_function(&local_448);
    is_method::is_method(&local_490,&this->m_base);
    cpp_function::
    cpp_function<pybind11::detail::enum_base::init(bool,bool)::_lambda(pybind11::object,pybind11::object)_14_,pybind11::is_method,void>
              (&local_480,&local_481,&local_490);
    object_api<pybind11::handle>::attr(&local_4b0,(object_api<pybind11::handle> *)this,"__ne__");
    accessor<pybind11::detail::accessor_policies::str_attr>::operator=(&local_4b0,&local_480);
    accessor<pybind11::detail::accessor_policies::str_attr>::~accessor(&local_4b0);
    cpp_function::~cpp_function(&local_480);
    if ((local_11 & 1) != 0) {
      is_method::is_method(&local_4c8,&this->m_base);
      cpp_function::
      cpp_function<pybind11::detail::enum_base::init(bool,bool)::_lambda(pybind11::object,pybind11::object)_15_,pybind11::is_method,void>
                (&local_4b8,&local_4b9,&local_4c8);
      object_api<pybind11::handle>::attr(&local_4e8,(object_api<pybind11::handle> *)this,"__lt__");
      accessor<pybind11::detail::accessor_policies::str_attr>::operator=(&local_4e8,&local_4b8);
      accessor<pybind11::detail::accessor_policies::str_attr>::~accessor(&local_4e8);
      cpp_function::~cpp_function(&local_4b8);
      is_method::is_method(&local_500,&this->m_base);
      cpp_function::
      cpp_function<pybind11::detail::enum_base::init(bool,bool)::_lambda(pybind11::object,pybind11::object)_16_,pybind11::is_method,void>
                (&local_4f0,&local_4f1,&local_500);
      object_api<pybind11::handle>::attr(&local_520,(object_api<pybind11::handle> *)this,"__gt__");
      accessor<pybind11::detail::accessor_policies::str_attr>::operator=(&local_520,&local_4f0);
      accessor<pybind11::detail::accessor_policies::str_attr>::~accessor(&local_520);
      cpp_function::~cpp_function(&local_4f0);
      is_method::is_method(&local_538,&this->m_base);
      cpp_function::
      cpp_function<pybind11::detail::enum_base::init(bool,bool)::_lambda(pybind11::object,pybind11::object)_17_,pybind11::is_method,void>
                (&local_528,&local_529,&local_538);
      object_api<pybind11::handle>::attr(&local_558,(object_api<pybind11::handle> *)this,"__le__");
      accessor<pybind11::detail::accessor_policies::str_attr>::operator=(&local_558,&local_528);
      accessor<pybind11::detail::accessor_policies::str_attr>::~accessor(&local_558);
      cpp_function::~cpp_function(&local_528);
      is_method::is_method(&local_570,&this->m_base);
      cpp_function::
      cpp_function<pybind11::detail::enum_base::init(bool,bool)::_lambda(pybind11::object,pybind11::object)_18_,pybind11::is_method,void>
                (&local_560,&local_561,&local_570);
      object_api<pybind11::handle>::attr
                ((str_attr_accessor *)&getstate,(object_api<pybind11::handle> *)this,"__ge__");
      accessor<pybind11::detail::accessor_policies::str_attr>::operator=
                ((accessor<pybind11::detail::accessor_policies::str_attr> *)&getstate,&local_560);
      accessor<pybind11::detail::accessor_policies::str_attr>::~accessor
                ((accessor<pybind11::detail::accessor_policies::str_attr> *)&getstate);
      cpp_function::~cpp_function(&local_560);
    }
  }
  else {
    is_method::is_method(&local_180,&this->m_base);
    cpp_function::
    cpp_function<pybind11::detail::enum_base::init(bool,bool)::_lambda(pybind11::object,pybind11::object)_1_,pybind11::is_method,void>
              (&local_170,&local_171,&local_180);
    object_api<pybind11::handle>::attr(&local_1a0,(object_api<pybind11::handle> *)this,"__eq__");
    accessor<pybind11::detail::accessor_policies::str_attr>::operator=(&local_1a0,&local_170);
    accessor<pybind11::detail::accessor_policies::str_attr>::~accessor(&local_1a0);
    cpp_function::~cpp_function(&local_170);
    is_method::is_method(&local_1b8,&this->m_base);
    cpp_function::
    cpp_function<pybind11::detail::enum_base::init(bool,bool)::_lambda(pybind11::object,pybind11::object)_2_,pybind11::is_method,void>
              (&local_1a8,&local_1a9,&local_1b8);
    object_api<pybind11::handle>::attr(&local_1d8,(object_api<pybind11::handle> *)this,"__ne__");
    accessor<pybind11::detail::accessor_policies::str_attr>::operator=(&local_1d8,&local_1a8);
    accessor<pybind11::detail::accessor_policies::str_attr>::~accessor(&local_1d8);
    cpp_function::~cpp_function(&local_1a8);
    if ((local_11 & 1) != 0) {
      is_method::is_method(&local_1f0,&this->m_base);
      cpp_function::
      cpp_function<pybind11::detail::enum_base::init(bool,bool)::_lambda(pybind11::object,pybind11::object)_3_,pybind11::is_method,void>
                (&local_1e0,&local_1e1,&local_1f0);
      object_api<pybind11::handle>::attr(&local_210,(object_api<pybind11::handle> *)this,"__lt__");
      accessor<pybind11::detail::accessor_policies::str_attr>::operator=(&local_210,&local_1e0);
      accessor<pybind11::detail::accessor_policies::str_attr>::~accessor(&local_210);
      cpp_function::~cpp_function(&local_1e0);
      is_method::is_method(&local_228,&this->m_base);
      cpp_function::
      cpp_function<pybind11::detail::enum_base::init(bool,bool)::_lambda(pybind11::object,pybind11::object)_4_,pybind11::is_method,void>
                (&local_218,&local_219,&local_228);
      object_api<pybind11::handle>::attr(&local_248,(object_api<pybind11::handle> *)this,"__gt__");
      accessor<pybind11::detail::accessor_policies::str_attr>::operator=(&local_248,&local_218);
      accessor<pybind11::detail::accessor_policies::str_attr>::~accessor(&local_248);
      cpp_function::~cpp_function(&local_218);
      is_method::is_method(&local_260,&this->m_base);
      cpp_function::
      cpp_function<pybind11::detail::enum_base::init(bool,bool)::_lambda(pybind11::object,pybind11::object)_5_,pybind11::is_method,void>
                (&local_250,&local_251,&local_260);
      object_api<pybind11::handle>::attr(&local_280,(object_api<pybind11::handle> *)this,"__le__");
      accessor<pybind11::detail::accessor_policies::str_attr>::operator=(&local_280,&local_250);
      accessor<pybind11::detail::accessor_policies::str_attr>::~accessor(&local_280);
      cpp_function::~cpp_function(&local_250);
      is_method::is_method(&local_298,&this->m_base);
      cpp_function::
      cpp_function<pybind11::detail::enum_base::init(bool,bool)::_lambda(pybind11::object,pybind11::object)_6_,pybind11::is_method,void>
                (&local_288,&local_289,&local_298);
      object_api<pybind11::handle>::attr(&local_2b8,(object_api<pybind11::handle> *)this,"__ge__");
      accessor<pybind11::detail::accessor_policies::str_attr>::operator=(&local_2b8,&local_288);
      accessor<pybind11::detail::accessor_policies::str_attr>::~accessor(&local_2b8);
      cpp_function::~cpp_function(&local_288);
      is_method::is_method(&local_2d0,&this->m_base);
      cpp_function::
      cpp_function<pybind11::detail::enum_base::init(bool,bool)::_lambda(pybind11::object,pybind11::object)_7_,pybind11::is_method,void>
                (&local_2c0,&local_2c1,&local_2d0);
      object_api<pybind11::handle>::attr(&local_2f0,(object_api<pybind11::handle> *)this,"__and__");
      accessor<pybind11::detail::accessor_policies::str_attr>::operator=(&local_2f0,&local_2c0);
      accessor<pybind11::detail::accessor_policies::str_attr>::~accessor(&local_2f0);
      cpp_function::~cpp_function(&local_2c0);
      is_method::is_method(&local_308,&this->m_base);
      cpp_function::
      cpp_function<pybind11::detail::enum_base::init(bool,bool)::_lambda(pybind11::object,pybind11::object)_8_,pybind11::is_method,void>
                (&local_2f8,&local_2f9,&local_308);
      object_api<pybind11::handle>::attr(&local_328,(object_api<pybind11::handle> *)this,"__rand__")
      ;
      accessor<pybind11::detail::accessor_policies::str_attr>::operator=(&local_328,&local_2f8);
      accessor<pybind11::detail::accessor_policies::str_attr>::~accessor(&local_328);
      cpp_function::~cpp_function(&local_2f8);
      is_method::is_method(&local_340,&this->m_base);
      cpp_function::
      cpp_function<pybind11::detail::enum_base::init(bool,bool)::_lambda(pybind11::object,pybind11::object)_9_,pybind11::is_method,void>
                (&local_330,&local_331,&local_340);
      object_api<pybind11::handle>::attr(&local_360,(object_api<pybind11::handle> *)this,"__or__");
      accessor<pybind11::detail::accessor_policies::str_attr>::operator=(&local_360,&local_330);
      accessor<pybind11::detail::accessor_policies::str_attr>::~accessor(&local_360);
      cpp_function::~cpp_function(&local_330);
      is_method::is_method(&local_378,&this->m_base);
      cpp_function::
      cpp_function<pybind11::detail::enum_base::init(bool,bool)::_lambda(pybind11::object,pybind11::object)_10_,pybind11::is_method,void>
                (&local_368,&local_369,&local_378);
      object_api<pybind11::handle>::attr(&local_398,(object_api<pybind11::handle> *)this,"__ror__");
      accessor<pybind11::detail::accessor_policies::str_attr>::operator=(&local_398,&local_368);
      accessor<pybind11::detail::accessor_policies::str_attr>::~accessor(&local_398);
      cpp_function::~cpp_function(&local_368);
      is_method::is_method(&local_3b0,&this->m_base);
      cpp_function::
      cpp_function<pybind11::detail::enum_base::init(bool,bool)::_lambda(pybind11::object,pybind11::object)_11_,pybind11::is_method,void>
                (&local_3a0,&local_3a1,&local_3b0);
      object_api<pybind11::handle>::attr(&local_3d0,(object_api<pybind11::handle> *)this,"__xor__");
      accessor<pybind11::detail::accessor_policies::str_attr>::operator=(&local_3d0,&local_3a0);
      accessor<pybind11::detail::accessor_policies::str_attr>::~accessor(&local_3d0);
      cpp_function::~cpp_function(&local_3a0);
      is_method::is_method(&local_3e8,&this->m_base);
      cpp_function::
      cpp_function<pybind11::detail::enum_base::init(bool,bool)::_lambda(pybind11::object,pybind11::object)_12_,pybind11::is_method,void>
                (&local_3d8,&local_3d9,&local_3e8);
      object_api<pybind11::handle>::attr(&local_408,(object_api<pybind11::handle> *)this,"__rxor__")
      ;
      accessor<pybind11::detail::accessor_policies::str_attr>::operator=(&local_408,&local_3d8);
      accessor<pybind11::detail::accessor_policies::str_attr>::~accessor(&local_408);
      cpp_function::~cpp_function(&local_3d8);
      is_method::is_method(&local_420,&this->m_base);
      cpp_function::
      cpp_function<pybind11::detail::enum_base::init(bool,bool)::_lambda(pybind11::object)_1_,pybind11::is_method,void>
                (&local_410,&local_411,&local_420);
      object_api<pybind11::handle>::attr
                (&local_440,(object_api<pybind11::handle> *)this,"__invert__");
      accessor<pybind11::detail::accessor_policies::str_attr>::operator=(&local_440,&local_410);
      accessor<pybind11::detail::accessor_policies::str_attr>::~accessor(&local_440);
      cpp_function::~cpp_function(&local_410);
    }
  }
  is_method::is_method(&local_5b0,&this->m_base);
  cpp_function::
  cpp_function<pybind11::detail::enum_base::init(bool,bool)::_lambda(pybind11::object)_2_,pybind11::is_method,void>
            (&local_5a0,&local_5a1,&local_5b0);
  pybind11::object::object(&local_598,(object *)&local_5a0);
  cpp_function::~cpp_function(&local_5a0);
  object_api<pybind11::handle>::attr(&local_5d0,(object_api<pybind11::handle> *)this,"__getstate__")
  ;
  accessor<pybind11::detail::accessor_policies::str_attr>::operator=(&local_5d0,&local_598);
  accessor<pybind11::detail::accessor_policies::str_attr>::~accessor(&local_5d0);
  object_api<pybind11::handle>::attr(&local_5f0,(object_api<pybind11::handle> *)this,"__hash__");
  accessor<pybind11::detail::accessor_policies::str_attr>::operator=(&local_5f0,&local_598);
  accessor<pybind11::detail::accessor_policies::str_attr>::~accessor(&local_5f0);
  pybind11::object::~object(&local_598);
  return extraout_EAX;
}

Assistant:

PYBIND11_NOINLINE void init(bool is_arithmetic, bool is_convertible) {
        m_base.attr("__entries") = dict();
        auto property = handle((PyObject *) &PyProperty_Type);
        auto static_property = handle((PyObject *) get_internals().static_property_type);

        m_base.attr("__repr__") = cpp_function(
            [](handle arg) -> str {
                handle type = arg.get_type();
                object type_name = type.attr("__name__");
                dict entries = type.attr("__entries");
                for (const auto &kv : entries) {
                    object other = kv.second[int_(0)];
                    if (other.equal(arg))
                        return pybind11::str("{}.{}").format(type_name, kv.first);
                }
                return pybind11::str("{}.???").format(type_name);
            }, is_method(m_base)
        );

        m_base.attr("name") = property(cpp_function(
            [](handle arg) -> str {
                dict entries = arg.get_type().attr("__entries");
                for (const auto &kv : entries) {
                    if (handle(kv.second[int_(0)]).equal(arg))
                        return pybind11::str(kv.first);
                }
                return "???";
            }, is_method(m_base)
        ));

        m_base.attr("__doc__") = static_property(cpp_function(
            [](handle arg) -> std::string {
                std::string docstring;
                dict entries = arg.attr("__entries");
                if (((PyTypeObject *) arg.ptr())->tp_doc)
                    docstring += std::string(((PyTypeObject *) arg.ptr())->tp_doc) + "\n\n";
                docstring += "Members:";
                for (const auto &kv : entries) {
                    auto key = std::string(pybind11::str(kv.first));
                    auto comment = kv.second[int_(1)];
                    docstring += "\n\n  " + key;
                    if (!comment.is_none())
                        docstring += " : " + (std::string) pybind11::str(comment);
                }
                return docstring;
            }
        ), none(), none(), "");

        m_base.attr("__members__") = static_property(cpp_function(
            [](handle arg) -> dict {
                dict entries = arg.attr("__entries"), m;
                for (const auto &kv : entries)
                    m[kv.first] = kv.second[int_(0)];
                return m;
            }), none(), none(), ""
        );

        #define PYBIND11_ENUM_OP_STRICT(op, expr, strict_behavior)                     \
            m_base.attr(op) = cpp_function(                                            \
                [](object a, object b) {                                               \
                    if (!a.get_type().is(b.get_type()))                                \
                        strict_behavior;                                               \
                    return expr;                                                       \
                },                                                                     \
                is_method(m_base))

        #define PYBIND11_ENUM_OP_CONV(op, expr)                                        \
            m_base.attr(op) = cpp_function(                                            \
                [](object a_, object b_) {                                             \
                    int_ a(a_), b(b_);                                                 \
                    return expr;                                                       \
                },                                                                     \
                is_method(m_base))

        #define PYBIND11_ENUM_OP_CONV_LHS(op, expr)                                    \
            m_base.attr(op) = cpp_function(                                            \
                [](object a_, object b) {                                              \
                    int_ a(a_);                                                        \
                    return expr;                                                       \
                },                                                                     \
                is_method(m_base))

        if (is_convertible) {
            PYBIND11_ENUM_OP_CONV_LHS("__eq__", !b.is_none() &&  a.equal(b));
            PYBIND11_ENUM_OP_CONV_LHS("__ne__",  b.is_none() || !a.equal(b));

            if (is_arithmetic) {
                PYBIND11_ENUM_OP_CONV("__lt__",   a <  b);
                PYBIND11_ENUM_OP_CONV("__gt__",   a >  b);
                PYBIND11_ENUM_OP_CONV("__le__",   a <= b);
                PYBIND11_ENUM_OP_CONV("__ge__",   a >= b);
                PYBIND11_ENUM_OP_CONV("__and__",  a &  b);
                PYBIND11_ENUM_OP_CONV("__rand__", a &  b);
                PYBIND11_ENUM_OP_CONV("__or__",   a |  b);
                PYBIND11_ENUM_OP_CONV("__ror__",  a |  b);
                PYBIND11_ENUM_OP_CONV("__xor__",  a ^  b);
                PYBIND11_ENUM_OP_CONV("__rxor__", a ^  b);
                m_base.attr("__invert__") = cpp_function(
                    [](object arg) { return ~(int_(arg)); }, is_method(m_base));
            }
        } else {
            PYBIND11_ENUM_OP_STRICT("__eq__",  int_(a).equal(int_(b)), return false);
            PYBIND11_ENUM_OP_STRICT("__ne__", !int_(a).equal(int_(b)), return true);

            if (is_arithmetic) {
                #define PYBIND11_THROW throw type_error("Expected an enumeration of matching type!");
                PYBIND11_ENUM_OP_STRICT("__lt__", int_(a) <  int_(b), PYBIND11_THROW);
                PYBIND11_ENUM_OP_STRICT("__gt__", int_(a) >  int_(b), PYBIND11_THROW);
                PYBIND11_ENUM_OP_STRICT("__le__", int_(a) <= int_(b), PYBIND11_THROW);
                PYBIND11_ENUM_OP_STRICT("__ge__", int_(a) >= int_(b), PYBIND11_THROW);
                #undef PYBIND11_THROW
            }
        }

        #undef PYBIND11_ENUM_OP_CONV_LHS
        #undef PYBIND11_ENUM_OP_CONV
        #undef PYBIND11_ENUM_OP_STRICT

        object getstate = cpp_function(
            [](object arg) { return int_(arg); }, is_method(m_base));

        m_base.attr("__getstate__") = getstate;
        m_base.attr("__hash__") = getstate;
    }